

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int ravi_loadlib(lua_State *L)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *sym;
  void *plib;
  lua_CFunction p_Var4;
  undefined4 extraout_var;
  LClosure *cl;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  sym = luaL_checklstring(L,2,(size_t *)0x0);
  plib = checkclib(L,pcVar3);
  if (plib == (void *)0x0) {
    plib = lsys_load(L,pcVar3,(uint)(*sym == '*'));
    if (plib != (void *)0x0) {
      addtoclib(L,pcVar3,plib);
      goto LAB_00141d01;
    }
    pcVar3 = "open";
LAB_00141d67:
    bVar1 = false;
  }
  else {
LAB_00141d01:
    if (*sym == '*') {
      lua_pushboolean(L,1);
    }
    else {
      p_Var4 = lsys_sym(L,plib,sym);
      pcVar3 = "init";
      if (p_Var4 == (lua_CFunction)0x0) goto LAB_00141d67;
      iVar2 = (*p_Var4)(L);
      cl = (LClosure *)CONCAT44(extraout_var,iVar2);
      if (cl->p->sizeupvalues != (uint)cl->nupvalues) {
        __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/loadlib.c"
                      ,0x1b7,"int ravi_lookforfunc(lua_State *, const char *, const char *)");
      }
      luaF_initupvals(L,cl);
      ravi_closure_setenv(L);
    }
    pcVar3 = "init";
    bVar1 = true;
  }
  iVar2 = 1;
  if (!bVar1) {
    lua_pushnil(L);
    lua_rotate(L,-2,1);
    lua_pushstring(L,pcVar3);
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

static int ravi_loadlib (lua_State *L) {
  const char *path = luaL_checkstring(L, 1); /* Path to dynamic library */
  const char *init = luaL_checkstring(L, 2); /* Function to call */
  int stat = ravi_lookforfunc(L, path, init);
  if (stat == 0)  /* no errors? */
    return 1;  /* return the loaded function */
  else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (stat == ERRLIB) ?  LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}